

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

int ly_register_exts(lyext_plugin_list *plugin,char *log_name)

{
  lyext_plugin *plVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  lyext_plugin_list *plVar5;
  lyext_plugin_list *plVar6;
  char *local_60;
  uint local_38;
  uint local_34;
  uint32_t v;
  uint32_t u;
  lyext_plugin_complex *pluginc;
  lyext_plugin_list *p;
  char *log_name_local;
  lyext_plugin_list *plugin_local;
  
  local_34 = 0;
  do {
    if (plugin[local_34].name == (char *)0x0) {
      plVar5 = (lyext_plugin_list *)realloc(ext_plugins,(ulong)(ext_plugins_count + local_34) << 5);
      if (plVar5 == (lyext_plugin_list *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_exts")
        ;
        plugin_local._4_4_ = -1;
      }
      else {
        for (; ext_plugins = plVar5, local_34 != 0; local_34 = local_34 - 1) {
          plVar5 = ext_plugins + ext_plugins_count;
          plVar6 = plugin + (local_34 - 1);
          plVar5->module = plVar6->module;
          plVar5->revision = plVar6->revision;
          plVar5->name = plVar6->name;
          plVar5->plugin = plVar6->plugin;
          ext_plugins_count = ext_plugins_count + 1;
          plVar5 = ext_plugins;
        }
        plugin_local._4_4_ = 0;
      }
      return plugin_local._4_4_;
    }
    for (local_38 = 0; local_38 < ext_plugins_count; local_38 = local_38 + 1) {
      iVar3 = strcmp(plugin[local_34].name,ext_plugins[local_38].name);
      if (((iVar3 == 0) &&
          (iVar3 = strcmp(plugin[local_34].module,ext_plugins[local_38].module), iVar3 == 0)) &&
         ((plugin[local_34].revision == (char *)0x0 ||
          ((ext_plugins[local_38].revision == (char *)0x0 ||
           (iVar3 = strcmp(plugin[local_34].revision,ext_plugins[local_38].revision), iVar3 == 0))))
         )) {
        pcVar4 = "";
        if (plugin[local_34].revision != (char *)0x0) {
          pcVar4 = "@";
        }
        if (plugin[local_34].revision == (char *)0x0) {
          local_60 = "";
        }
        else {
          local_60 = plugin[local_34].revision;
        }
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
               "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
               ,log_name,plugin[local_34].name,plugin[local_34].module,pcVar4,local_60);
        return 1;
      }
    }
    if (((plugin[local_34].plugin)->type == LYEXT_COMPLEX) &&
       (plVar1 = plugin[local_34].plugin, lVar2._0_4_ = plVar1[1].type,
       lVar2._4_2_ = plVar1[1].flags, lVar2._6_2_ = *(undefined2 *)&plVar1[1].field_0x6, lVar2 != 0)
       ) {
      plVar1 = plugin[local_34].plugin;
      local_38 = 0;
      while (*(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18) != 0) {
        if (((0x37 < *(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18)) ||
            (*(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18) == 0x13)) ||
           (*(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18) == 0x16)) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                 "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)"
                 ,log_name,plugin[local_34].name,
                 ly_stmt_str[*(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18)]);
          return 1;
        }
        if (((1 < *(uint *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18 + 0x10)) &&
            (0x13 < *(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18))) &&
           (*(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18) < 0x1b)) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                 "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" substatement, which is not supported."
                 ,log_name,plugin[local_34].name,
                 ly_stmt_str[*(int *)(*(long *)(plVar1 + 1) + (ulong)local_38 * 0x18)]);
          return 1;
        }
        local_38 = local_38 + 1;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

API int
ly_register_exts(struct lyext_plugin_list *plugin, const char *log_name)
{
    struct lyext_plugin_list *p;
    struct lyext_plugin_complex *pluginc;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check extension implementations for collisions */
        for (v = 0; v < ext_plugins_count; v++) {
            if (!strcmp(plugin[u].name, ext_plugins[v].name) &&
                    !strcmp(plugin[u].module, ext_plugins[v].module) &&
                    (!plugin[u].revision || !ext_plugins[v].revision || !strcmp(plugin[u].revision, ext_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }

        /* check for valid supported substatements in case of complex extension */
        if (plugin[u].plugin->type == LYEXT_COMPLEX && ((struct lyext_plugin_complex *)plugin[u].plugin)->substmt) {
            pluginc = (struct lyext_plugin_complex *)plugin[u].plugin;
            for (v = 0; pluginc->substmt[v].stmt; v++) {
                if (pluginc->substmt[v].stmt >= LY_STMT_SUBMODULE ||
                        pluginc->substmt[v].stmt == LY_STMT_VERSION ||
                        pluginc->substmt[v].stmt == LY_STMT_YINELEM) {
                    LOGERR(NULL, LY_EINVAL,
                            "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)",
                            log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
                if (pluginc->substmt[v].cardinality > LY_STMT_CARD_MAND &&
                        pluginc->substmt[v].stmt >= LY_STMT_MODIFIER &&
                        pluginc->substmt[v].stmt <= LY_STMT_STATUS) {
                    LOGERR(NULL, LY_EINVAL, "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" "
                           "substatement, which is not supported.",
                           log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(ext_plugins, (ext_plugins_count + u) * sizeof *ext_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    ext_plugins = p;
    for (; u; u--) {
        memcpy(&ext_plugins[ext_plugins_count], &plugin[u - 1], sizeof *plugin);
        ext_plugins_count++;
    }

    return 0;
}